

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O1

LY_ERR json_print_member(jsonpr_ctx *pctx,lyd_node *node,ly_bool is_attr)

{
  int iVar1;
  LY_ERR LVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  char *format;
  ly_out *out;
  char *pcVar6;
  uint uVar7;
  
  if (pctx->level <= pctx->level_printed) {
    pcVar4 = "";
    if ((pctx->options & 2) == 0) {
      pcVar4 = "\n";
    }
    ly_print_(pctx->out,",%s",pcVar4);
  }
  if ((pctx->level == 1) || (iVar1 = json_nscmp(node,pctx->parent), iVar1 != 0)) {
    out = pctx->out;
    uVar7 = 0;
    if ((pctx->options & 2) == 0) {
      uVar7 = (uint)pctx->level * 2;
    }
    pcVar4 = "@";
    if (is_attr == '\0') {
      pcVar4 = "";
    }
    pcVar3 = node_prefix(node);
    format = "%*s\"%s%s:%s\":%s";
    uVar5 = (ulong)uVar7;
    pcVar6 = node->schema->name;
  }
  else {
    out = pctx->out;
    uVar5 = 0;
    pcVar6 = "\t";
    if ((pctx->options & 2) == 0) {
      uVar5 = (ulong)((uint)pctx->level * 2);
      pcVar6 = ", ";
    }
    pcVar6 = pcVar6 + 1;
    pcVar4 = "@";
    if (is_attr == '\0') {
      pcVar4 = "";
    }
    pcVar3 = node->schema->name;
    format = "%*s\"%s%s\":%s";
  }
  LVar2 = ly_print_(out,format,uVar5,"",pcVar4,pcVar3,pcVar6);
  return LVar2;
}

Assistant:

static LY_ERR
json_print_member(struct jsonpr_ctx *pctx, const struct lyd_node *node, ly_bool is_attr)
{
    PRINT_COMMA;
    if ((LEVEL == 1) || json_nscmp(node, pctx->parent)) {
        /* print "namespace" */
        ly_print_(pctx->out, "%*s\"%s%s:%s\":%s", INDENT, is_attr ? "@" : "",
                node_prefix(node), node->schema->name, DO_FORMAT ? " " : "");
    } else {
        ly_print_(pctx->out, "%*s\"%s%s\":%s", INDENT, is_attr ? "@" : "", node->schema->name, DO_FORMAT ? " " : "");
    }

    return LY_SUCCESS;
}